

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serve_dynamic_content.hpp
# Opt level: O0

container *
pstore::http::details::get_commands<ServeDynamicContent_Version_Test::TestBody()::__0,int>(void)

{
  int iVar1;
  
  if (get_commands<ServeDynamicContent_Version_Test::TestBody()::$_0,int>()::commands_abi_cxx11_ ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&get_commands<ServeDynamicContent_Version_Test::TestBody()::$_0,int>()
                                 ::commands_abi_cxx11_);
    if (iVar1 != 0) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::error_or<int>_((lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_dynamic_content.cpp:47:19),_int,_const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<const_char_(&)[8],_pstore::error_or<int>_(&)((lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_unittests_http_test_serve_dynamic_content_cpp:47:19),_int,_const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_true>
                (get_commands<ServeDynamicContent_Version_Test::TestBody()::$_0,int>()::
                 commands_abi_cxx11_._M_elems,(char (*) [8])0x214b02,
                 handle_version<ServeDynamicContent_Version_Test::TestBody()::__0,int>);
      __cxa_atexit(std::
                   array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::error_or<int>_((lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_dynamic_content.cpp:47:19),_int,_const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>,_1UL>
                   ::~array,&get_commands<ServeDynamicContent_Version_Test::TestBody()::$_0,int>()::
                             commands_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&get_commands<ServeDynamicContent_Version_Test::TestBody()::$_0,int>()::
                           commands_abi_cxx11_);
    }
  }
  return &get_commands<ServeDynamicContent_Version_Test::TestBody()::$_0,int>()::commands_abi_cxx11_
  ;
}

Assistant:

typename commands_helper<Sender, IO>::container const & get_commands () {
                static typename commands_helper<Sender, IO>::container const commands = {
                    {{"version", handle_version<Sender, IO>}},
                };
                return commands;
            }